

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O3

int main(void)

{
  pointer plVar1;
  bool bVar2;
  int iVar3;
  istream *this;
  longlong lVar4;
  int iVar5;
  uint uVar6;
  size_type __n;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int x;
  char elem;
  int N;
  int M;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  table;
  Network transport;
  allocator_type local_135;
  int local_134;
  uint local_130;
  int local_12c;
  long local_128;
  long local_120;
  long local_118;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  local_110;
  long local_f8;
  long local_f0;
  long local_e8;
  Network local_e0;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x106188) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_134);
  std::istream::operator>>(this,(int *)&local_130);
  __n = (size_type)local_134;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&local_e0,(long)(int)local_130,
             (allocator_type *)&local_12c);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&local_110,__n,(value_type *)&local_e0,&local_135);
  if (local_e0.q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map != (_Map_pointer)0x0) {
    operator_delete(local_e0.q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map);
  }
  Network::Network(&local_e0,local_130 * local_134 + 2);
  uVar7 = (ulong)local_130;
  iVar3 = local_134;
  if (local_134 < 1) {
    local_120 = 0;
    local_118 = 0;
    uVar6 = local_130;
  }
  else {
    lVar12 = 0;
    local_120 = 0;
    local_118 = 0;
    do {
      if (0 < (int)uVar7) {
        lVar10 = 0;
        do {
          std::operator>>((istream *)&std::cin,(char *)&local_135);
          if ((byte)local_135 < 0x4e) {
            if (local_135 != (allocator_type)0x2e) {
              lVar4 = 1;
              if (local_135 != (allocator_type)0x48) {
LAB_0010170b:
                lVar4 = 4;
              }
              goto LAB_0010172d;
            }
            local_110.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar12].
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] = -1;
          }
          else {
            if (local_135 == (allocator_type)0x4e) {
              lVar4 = 3;
            }
            else {
              if (local_135 != (allocator_type)0x4f) goto LAB_0010170b;
              lVar4 = 2;
            }
LAB_0010172d:
            local_110.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar12].
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] = lVar4;
            iVar3 = (int)lVar10;
            iVar5 = (int)lVar12;
            if ((iVar3 + iVar5 & 1U) == 0) {
              Network::add_edge(&local_e0,local_134 * local_130,local_130 * iVar5 + iVar3,lVar4);
              local_120 = local_120 +
                          local_110.
                          super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12].
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
            }
            else {
              Network::add_edge(&local_e0,iVar5 * local_130 + iVar3,local_130 * local_134 + 1,lVar4)
              ;
              local_118 = local_118 +
                          local_110.
                          super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12].
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
            }
          }
          lVar10 = lVar10 + 1;
          uVar7 = (ulong)(int)local_130;
          iVar3 = local_134;
        } while (lVar10 < (long)uVar7);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar3);
    uVar6 = (uint)uVar7;
    if (0 < iVar3) {
      lVar12 = 0;
      do {
        if ((int)uVar7 < 1) {
          lVar10 = lVar12 + 1;
        }
        else {
          local_f8 = lVar12 + -1;
          lVar10 = lVar12 + 1;
          local_f0 = lVar10 * 3;
          local_e8 = local_f8 * 3;
          lVar8 = 1;
          local_128 = lVar10;
          do {
            plVar1 = local_110.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12].
                     super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((plVar1[lVar8 + -1] != -1) && (((char)lVar12 + (char)lVar8 + 1U & 1) == 0)) {
              iVar5 = (int)uVar7;
              iVar11 = iVar5 * (int)lVar12;
              iVar3 = (int)lVar8;
              x = iVar11 + -1 + iVar3;
              if ((lVar8 < iVar5) && (plVar1[lVar8] != -1)) {
                Network::add_edge(&local_e0,x,iVar3 + iVar11,1);
                lVar10 = local_128;
              }
              if ((lVar8 != 1) &&
                 (local_110.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar12].
                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8 + -2] != -1)) {
                Network::add_edge(&local_e0,x,iVar11 + -2 + iVar3,1);
                lVar10 = local_128;
              }
              if ((lVar12 != 0) &&
                 ((&((local_110.
                      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                    super__Vector_impl_data._M_start)[local_e8][lVar8 + -1] != -1)) {
                Network::add_edge(&local_e0,x,iVar5 * (int)local_f8 + iVar3 + -1,1);
                lVar10 = local_128;
              }
              if ((lVar10 < local_134) &&
                 ((&((local_110.
                      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                    super__Vector_impl_data._M_start)[local_f0][lVar8 + -1] != -1)) {
                Network::add_edge(&local_e0,x,iVar5 * (int)lVar10 + iVar3 + -1,1);
                lVar10 = local_128;
              }
            }
            uVar7 = (ulong)(int)local_130;
            bVar2 = lVar8 < (long)uVar7;
            lVar8 = lVar8 + 1;
            iVar3 = local_134;
          } while (bVar2);
        }
        uVar6 = (uint)uVar7;
        lVar12 = lVar10;
      } while (lVar10 < iVar3);
    }
  }
  local_12c = 1;
  lVar12 = 0;
  iVar5 = 2;
  do {
    iVar11 = iVar5;
    lVar4 = Network::BFS(&local_e0,uVar6 * iVar3,uVar6 * iVar3 + 1,&local_12c);
    lVar12 = lVar12 + lVar4;
    iVar5 = iVar11 + 1;
    local_12c = iVar11;
  } while (lVar4 != 0);
  if (lVar12 == local_118) {
    pcVar9 = "Invalid";
    if (local_118 != 0 && local_118 == local_120) {
      pcVar9 = "Valid";
    }
    lVar12 = (ulong)(local_118 == 0 || local_118 != local_120) * 2 + 5;
  }
  else {
    lVar12 = 7;
    pcVar9 = "Invalid";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar12);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector(&local_e0.g);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_e0.adjacency);
  if (local_e0.col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&local_e0);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector(&local_110);
  return 0;
}

Assistant:

int main(){
    int N, M;
    std::ios_base::sync_with_stdio(false);
    std::cin.tie(0);
    std::cin >> N >> M;
    std::vector<std::vector<long long> > table(N, std::vector<long long>(M));
    Network transport(N * M + 2);
    long long out = 0, in = 0;
    char elem;
    for (int i = 0; i < N; ++i) { //считываем элементы
        for (int j = 0; j < M; ++j) {
            std::cin >> elem;
            table[i][j] = valence(elem);
            if(elem == '.') {
                continue;
            }
            if((i + j) % 2 == 0) {
                transport.add_edge(N * M, M * i + j, table[i][j]);
                out += table[i][j];
            } else {
                transport.add_edge(M * i + j, N * M + 1, table[i][j]);
                in += table[i][j];
            }
        }
    }
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < M; ++j) {
            if(table[i][j] == -1 || (i + j) % 2 == 1) {
                continue;
            }
            int current_vertex = i * M + j; //текущая вершина; ниже - её соседи
            int right_neighbour = i * M + j + 1;
            int left_neighbour = i * M + j - 1;
            int up_neighbour = (i - 1) * M + j;
            int down_neighbour = (i + 1) * M + j;
            if ((j + 1) < M && table[i][j + 1] != -1) {
                transport.add_edge(current_vertex, right_neighbour, 1);
            }
            if ((j - 1) >= 0 && table[i][j - 1] != -1) {
                transport.add_edge(current_vertex, left_neighbour, 1);
            }
            if ((i - 1) >= 0 && table[i - 1][j] != -1) {
                transport.add_edge(current_vertex, up_neighbour, 1);
            }
            if ((i + 1) < N && table[i + 1][j] != -1) {
                transport.add_edge(current_vertex, down_neighbour, 1);
            }
        }
    }
    long long throughput = transport.EdmondsKarp(N * M, N * M + 1);
    if (throughput == in && throughput == out && throughput != 0){
        std::cout << "Valid";
    } else {
        std::cout << "Invalid";
    }
    return 0;
}